

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::CheckDecorationsFromDecoration(ValidationState_t *vstate)

{
  ushort uVar1;
  uint16_t uVar2;
  _Rb_tree_color _Var3;
  uint type_id;
  pointer ppVar4;
  bool bVar5;
  bool bVar6;
  int32_t iVar7;
  uint uVar8;
  uint32_t uVar9;
  StorageClass SVar10;
  spv_result_t sVar11;
  Op OVar12;
  uint32_t uVar13;
  Instruction *inst;
  Instruction *pIVar14;
  DiagnosticStream *pDVar15;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var16;
  ValidationState_t *pVVar17;
  long lVar18;
  ValidationState_t *pVVar19;
  pointer ppVar20;
  char *pcVar21;
  size_t index;
  int iVar22;
  int iVar23;
  ValidationState_t *unaff_R13;
  ValidationState_t *__return_storage_ptr__;
  bool bVar24;
  char *dec_name;
  spv_result_t local_280;
  string local_278;
  uint local_254;
  ValidationState_t *local_250;
  ValidationState_t *local_248;
  ValidationState_t *local_240;
  ValidationState_t *local_238;
  _Rb_tree_node_base *local_230;
  string local_228;
  spv_result_t local_38;
  
  bVar5 = EnumSet<spv::Capability>::contains(&vstate->module_capabilities_,CapabilityShader);
  pVVar17 = (ValidationState_t *)
            (vstate->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pVVar19 = (ValidationState_t *)&(vstate->id_decorations_)._M_t._M_impl.super__Rb_tree_header;
  local_240 = pVVar19;
  if (pVVar17 != pVVar19) {
    do {
      __return_storage_ptr__ = (ValidationState_t *)0x3;
      iVar23 = 3;
      if ((pVVar17->unresolved_forward_ids_)._M_h._M_element_count != 0) {
        inst = ValidationState_t::FindDef(vstate,pVVar17->generator_);
        if (inst == (Instruction *)0x0) {
          __assert_fail("inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                        ,0x7f8,
                        "spv_result_t spvtools::val::(anonymous namespace)::CheckDecorationsFromDecoration(ValidationState_t &)"
                       );
        }
        if ((inst->inst_).opcode != 0x49) {
          p_Var16 = (_Rb_tree_node_base *)(pVVar17->unresolved_forward_ids_)._M_h._M_bucket_count;
          local_230 = (_Rb_tree_node_base *)&pVVar17->total_functions_;
          local_238 = pVVar17;
          if (p_Var16 != local_230) {
            do {
              sVar11 = (spv_result_t)pVVar17;
              _Var3 = p_Var16[1]._M_color;
              uVar8 = (uint)unaff_R13;
              if ((int)_Var3 < 0x18) {
                if (_Var3 + ~_S_black < 2) {
                  if ((inst->inst_).result_id == 0) {
                    __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                                  ,0x7b8,
                                  "spv_result_t spvtools::val::(anonymous namespace)::CheckBlockDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                                 );
                  }
                  pVVar19 = (ValidationState_t *)0x0;
                  if ((inst->inst_).opcode != 0x1e) {
                    local_278._M_dataplus._M_p = "BufferBlock";
                    if (_Var3 == 2) {
                      local_278._M_dataplus._M_p = "Block";
                    }
                    ValidationState_t::diag
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                               SPV_ERROR_INVALID_ID,inst);
                    __return_storage_ptr__ =
                         (ValidationState_t *)
                         DiagnosticStream::operator<<
                                   ((DiagnosticStream *)&stack0xfffffffffffffdf8,(char **)&local_278
                                   );
                    lVar18 = 0x21;
                    pcVar21 = " decoration on a non-struct type.";
                    goto LAB_0062f8b5;
                  }
                }
                else {
                  if (_Var3 != _S_red) goto switchD_0062f2ef_caseD_19;
                  iVar7 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
                  pVVar19 = (ValidationState_t *)0x0;
                  if ((iVar7 != 0) &&
                     ((p_Var16[2]._M_color == ~_S_red || ((inst->inst_).opcode != 0x1e)))) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                               SPV_ERROR_INVALID_ID,inst);
                    lVar18 = 0x35;
                    pcVar21 = "RelaxPrecision decoration cannot be applied to a type";
                    goto LAB_0062f818;
                  }
                }
                goto LAB_0062f8cc;
              }
              switch(_Var3) {
              case 0x18:
                if ((inst->inst_).result_id == 0) {
                  __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                                ,0x6c6,
                                "spv_result_t spvtools::val::(anonymous namespace)::CheckNonWritableDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                               );
                }
                if (p_Var16[2]._M_color == ~_S_red) {
                  type_id = (inst->inst_).type_id;
                  pVVar17 = (ValidationState_t *)(ulong)type_id;
                  uVar1 = (inst->inst_).opcode;
                  local_254 = uVar8;
                  if (uVar1 < 0x1142) {
                    if (uVar1 == 0x37) goto LAB_0062fbe2;
                    index = 2;
                    if (uVar1 == 0x3b) goto LAB_0062fbbe;
LAB_0062fac4:
                    ValidationState_t::diag
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                               SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&stack0xfffffffffffffdf8,
                               "Target of NonWritable decoration must be a memory object declaration (a variable or a function parameter)"
                               ,0x69);
                    sVar11 = local_38;
LAB_0062fc95:
                    DiagnosticStream::~DiagnosticStream
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8);
                    bVar24 = false;
                    __return_storage_ptr__ = (ValidationState_t *)(ulong)(uint)sVar11;
                  }
                  else if (uVar1 == 0x1142) {
                    index = 3;
LAB_0062fbbe:
                    SVar10 = Instruction::GetOperandAs<spv::StorageClass>(inst,index);
                    if (((SVar10 & ~Input) != Private) ||
                       (bVar24 = true,
                       (vstate->features_).nonwritable_var_in_function_or_private == false))
                    goto LAB_0062fbe2;
                  }
                  else {
                    if (uVar1 != 0x1516) goto LAB_0062fac4;
LAB_0062fbe2:
                    bVar6 = ValidationState_t::IsPointerToUniformBlock(vstate,type_id);
                    bVar24 = true;
                    __return_storage_ptr__ = vstate;
                    if ((!bVar6) &&
                       (((bVar6 = ValidationState_t::IsPointerToStorageBuffer(vstate,type_id),
                         !bVar6 && (bVar6 = ValidationState_t::IsPointerToStorageImage
                                                      (vstate,type_id), uVar1 != 0x1516)) &&
                        (!bVar6)))) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                                 SPV_ERROR_INVALID_ID,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&stack0xfffffffffffffdf8,
                                 "Target of NonWritable decoration is invalid: must point to a storage image, uniform block, "
                                 ,0x5b);
                      local_278._M_dataplus._M_p = "or storage buffer";
                      if ((vstate->features_).nonwritable_var_in_function_or_private != false) {
                        local_278._M_dataplus._M_p =
                             "storage buffer, or variable in Private or Function storage class";
                      }
                      pDVar15 = DiagnosticStream::operator<<
                                          ((DiagnosticStream *)&stack0xfffffffffffffdf8,
                                           (char **)&local_278);
                      sVar11 = pDVar15->error_;
                      goto LAB_0062fc95;
                    }
                  }
                  unaff_R13 = (ValidationState_t *)(ulong)local_254;
                  if (bVar24) goto LAB_0062fca7;
                }
                else {
LAB_0062fca7:
                  __return_storage_ptr__ = (ValidationState_t *)0x0;
                }
                bVar24 = (int)__return_storage_ptr__ != 0;
                if (bVar24) {
                  unaff_R13 = __return_storage_ptr__;
                }
                goto joined_r0x0062ff75;
              case 0x19:
              case 0x1c:
              case 0x1d:
                goto switchD_0062f2ef_caseD_19;
              case 0x1a:
              case 0x1b:
                local_278._M_dataplus._M_p = "UniformId";
                if (_Var3 == 0x1a) {
                  local_278._M_dataplus._M_p = "Uniform";
                }
                uVar9 = (inst->inst_).type_id;
                if (uVar9 == 0) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                             SPV_ERROR_INVALID_ID,inst);
                  __return_storage_ptr__ =
                       (ValidationState_t *)
                       DiagnosticStream::operator<<
                                 ((DiagnosticStream *)&stack0xfffffffffffffdf8,(char **)&local_278);
                  lVar18 = 0x23;
                  pcVar21 = " decoration applied to a non-object";
LAB_0062f8b5:
                  unaff_R13 = (ValidationState_t *)((ulong)unaff_R13 & 0xffffffff);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)__return_storage_ptr__,pcVar21,lVar18);
                  pVVar19 = (ValidationState_t *)
                            (ulong)(uint)(__return_storage_ptr__->all_definitions_)._M_h.
                                         _M_bucket_count;
                  pVVar17 = unaff_R13;
                  goto LAB_0062f8c7;
                }
                pIVar14 = ValidationState_t::FindDef(vstate,uVar9);
                if (pIVar14 == (Instruction *)0x0) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                             SPV_ERROR_INVALID_ID,inst);
                  __return_storage_ptr__ =
                       (ValidationState_t *)
                       DiagnosticStream::operator<<
                                 ((DiagnosticStream *)&stack0xfffffffffffffdf8,(char **)&local_278);
                  lVar18 = 0x32;
                  pcVar21 = " decoration applied to an object with invalid type";
LAB_0062f9b3:
                  unaff_R13 = (ValidationState_t *)((ulong)unaff_R13 & 0xffffffff);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)__return_storage_ptr__,pcVar21,lVar18);
                  pVVar19 = (ValidationState_t *)
                            (ulong)(uint)(__return_storage_ptr__->all_definitions_)._M_h.
                                         _M_bucket_count;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&stack0xfffffffffffffdf8);
                  bVar24 = false;
                  pVVar17 = unaff_R13;
                }
                else {
                  bVar24 = true;
                  pVVar19 = vstate;
                  if ((pIVar14->inst_).opcode == 0x13) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                               SPV_ERROR_INVALID_ID,inst);
                    __return_storage_ptr__ =
                         (ValidationState_t *)
                         DiagnosticStream::operator<<
                                   ((DiagnosticStream *)&stack0xfffffffffffffdf8,(char **)&local_278
                                   );
                    lVar18 = 0x2d;
                    pcVar21 = " decoration applied to a value with void type";
                    goto LAB_0062f9b3;
                  }
                }
                if (bVar24) {
                  if (p_Var16[1]._M_color == 0x1b) {
                    if ((long)p_Var16[1]._M_left - (long)p_Var16[1]._M_parent != 4) {
                      __assert_fail("decoration.params().size() == 1 && \"Grammar ensures UniformId has one parameter\""
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                                    ,0x71b,
                                    "spv_result_t spvtools::val::(anonymous namespace)::CheckUniformDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                                   );
                    }
                    sVar11 = ValidateExecutionScope(vstate,inst,(p_Var16[1]._M_parent)->_M_color);
                    if (sVar11 != SPV_SUCCESS) {
                      pVVar19 = (ValidationState_t *)(ulong)(uint)sVar11;
                      break;
                    }
                  }
                  pVVar19 = (ValidationState_t *)0x0;
                }
                break;
              case 0x1e:
                uVar2 = (inst->inst_).opcode;
                pVVar19 = (ValidationState_t *)0x0;
                if ((uVar2 == 0x3b) || ((uVar2 == 0x1e && (p_Var16[2]._M_color != ~_S_red)))) break;
                ValidationState_t::diag
                          ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,SPV_ERROR_INVALID_ID,
                           inst);
                lVar18 = 0x53;
                pcVar21 = 
                "Location decoration can only be applied to a variable or member of a structure type"
                ;
LAB_0062f818:
                __return_storage_ptr__ = (ValidationState_t *)&stack0xfffffffffffffdf8;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)__return_storage_ptr__,pcVar21,lVar18);
                pVVar19 = (ValidationState_t *)(ulong)(uint)local_38;
LAB_0062f8c7:
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&stack0xfffffffffffffdf8);
                break;
              case 0x1f:
                if ((inst->inst_).result_id == 0) {
                  __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                                ,0x74b,
                                "spv_result_t spvtools::val::(anonymous namespace)::CheckComponentDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                               );
                }
                if ((long)p_Var16[1]._M_left - (long)p_Var16[1]._M_parent != 4) {
                  __assert_fail("decoration.params().size() == 1 && \"Grammar ensures Component has one parameter\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                                ,0x74d,
                                "spv_result_t spvtools::val::(anonymous namespace)::CheckComponentDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                               );
                }
                uVar2 = (inst->inst_).opcode;
                if ((long)(int)p_Var16[2]._M_color == -1) {
                  if (uVar2 == 0x37) {
                    SVar10 = Max;
LAB_0062fb0a:
                    bVar24 = SVar10 == Max || (SVar10 & ~StorageClassUniform) == Input;
                    if (((SVar10 == Input) || (SVar10 == Output)) || (SVar10 == Max)) {
                      uVar9 = (inst->inst_).type_id;
                      bVar6 = ValidationState_t::IsPointerType(vstate,uVar9);
                      if (bVar6) {
                        pIVar14 = ValidationState_t::FindDef(vstate,uVar9);
                        uVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
                      }
                      __return_storage_ptr__ = (ValidationState_t *)(ulong)uVar9;
                      pVVar17 = vstate;
                    }
                    else {
                      __return_storage_ptr__ = (ValidationState_t *)&stack0xfffffffffffffdf8;
                      ValidationState_t::diag
                                ((DiagnosticStream *)__return_storage_ptr__,vstate,
                                 SPV_ERROR_INVALID_ID,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)__return_storage_ptr__,
                                 "Target of Component decoration is invalid: must point to a Storage Class of Input(1) or Output(3). Found Storage Class "
                                 ,0x77);
                      std::ostream::_M_insert<unsigned_long>((ulong)__return_storage_ptr__);
                      pVVar17 = (ValidationState_t *)(ulong)(uint)local_38;
                      DiagnosticStream::~DiagnosticStream
                                ((DiagnosticStream *)__return_storage_ptr__);
                    }
                  }
                  else {
                    if (uVar2 == 0x3b) {
                      SVar10 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
                      goto LAB_0062fb0a;
                    }
                    ValidationState_t::diag
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                               SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&stack0xfffffffffffffdf8,
                               "Target of Component decoration must be a memory object declaration (a variable or a function parameter)"
                               ,0x67);
                    pVVar17 = (ValidationState_t *)(ulong)(uint)local_38;
                    DiagnosticStream::~DiagnosticStream
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8);
                    bVar24 = false;
                  }
                  sVar11 = (spv_result_t)pVVar17;
                  if (bVar24) goto LAB_0062fd12;
                }
                else if (uVar2 == 0x1e) {
                  __return_storage_ptr__ =
                       (ValidationState_t *)
                       (ulong)(inst->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start
                              [(long)(int)p_Var16[2]._M_color + 2];
LAB_0062fd12:
                  bVar24 = spvIsVulkanEnv(vstate->context_->target_env);
                  if (!bVar24) goto LAB_0062ff6b;
                  OVar12 = ValidationState_t::GetIdOpcode(vstate,(uint32_t)__return_storage_ptr__);
                  while (uVar9 = (uint32_t)__return_storage_ptr__, OVar12 == OpTypeArray) {
                    pIVar14 = ValidationState_t::FindDef(vstate,uVar9);
                    uVar8 = (pIVar14->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[2];
                    __return_storage_ptr__ = (ValidationState_t *)(ulong)uVar8;
                    OVar12 = ValidationState_t::GetIdOpcode(vstate,uVar8);
                  }
                  bVar24 = ValidationState_t::IsIntScalarOrVectorType(vstate,uVar9);
                  local_280 = sVar11;
                  if ((!bVar24) &&
                     (bVar24 = ValidationState_t::IsFloatScalarOrVectorType(vstate,uVar9), !bVar24))
                  {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                               SPV_ERROR_INVALID_ID,inst);
                    ValidationState_t::VkErrorID_abi_cxx11_(&local_278,vstate,0x2957,(char *)0x0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&stack0xfffffffffffffdf8,local_278._M_dataplus._M_p,
                               local_278._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&stack0xfffffffffffffdf8,
                               "Component decoration specified for type ",0x28);
                    ValidationState_t::getIdName_abi_cxx11_(&local_228,vstate,uVar9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&stack0xfffffffffffffdf8,local_228._M_dataplus._M_p,
                               local_228._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&stack0xfffffffffffffdf8," that is not a scalar or vector"
                               ,0x1f);
                    sVar11 = local_38;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228._M_dataplus._M_p != &local_228.field_2) {
                      operator_delete(local_228._M_dataplus._M_p,
                                      local_228.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_278._M_dataplus._M_p != &local_278.field_2) {
                      operator_delete(local_278._M_dataplus._M_p,
                                      local_278.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_0062faa2;
                  }
                  pVVar19 = (ValidationState_t *)(ulong)(p_Var16[1]._M_parent)->_M_color;
                  if ((ValidationState_t *)0x3 < pVVar19) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                               SPV_ERROR_INVALID_ID,inst);
                    ValidationState_t::VkErrorID_abi_cxx11_(&local_278,vstate,0x1338,(char *)0x0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&stack0xfffffffffffffdf8,local_278._M_dataplus._M_p,
                               local_278._M_string_length);
                    lVar18 = 0x35;
                    pcVar21 = "Component decoration value must not be greater than 3";
                    goto LAB_0062fdf1;
                  }
                  local_248 = pVVar19;
                  uVar13 = ValidationState_t::GetDimension(vstate,uVar9);
                  local_250 = (ValidationState_t *)CONCAT44(extraout_var,uVar13);
                  uVar9 = ValidationState_t::GetBitWidth(vstate,uVar9);
                  pVVar17 = (ValidationState_t *)(ulong)(uint)sVar11;
                  uVar8 = (uint)local_250;
                  if (uVar9 == 0x10) {
LAB_0062fe6e:
                    uVar8 = uVar8 + (int)local_248;
                    __return_storage_ptr__ = local_248;
                    if (4 < uVar8) {
                      local_250 = (ValidationState_t *)(ulong)uVar8;
                      ValidationState_t::diag
                                ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                                 SPV_ERROR_INVALID_ID,inst);
                      ValidationState_t::VkErrorID_abi_cxx11_(&local_278,vstate,0x1339,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&stack0xfffffffffffffdf8,local_278._M_dataplus._M_p,
                                 local_278._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&stack0xfffffffffffffdf8,
                                 "Sequence of components starting with ",0x25);
                      std::ostream::_M_insert<unsigned_long>((ulong)&stack0xfffffffffffffdf8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&stack0xfffffffffffffdf8," and ending with ",0x11);
                      __return_storage_ptr__ = local_250;
                      std::ostream::_M_insert<unsigned_long>((ulong)&stack0xfffffffffffffdf8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&stack0xfffffffffffffdf8," gets larger than 3",0x13);
                      pVVar17 = (ValidationState_t *)(ulong)(uint)local_38;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_278._M_dataplus._M_p != &local_278.field_2) {
                        operator_delete(local_278._M_dataplus._M_p,
                                        local_278.field_2._M_allocated_capacity + 1);
                      }
                      DiagnosticStream::~DiagnosticStream
                                ((DiagnosticStream *)&stack0xfffffffffffffdf8);
                      uVar8 = (uint)__return_storage_ptr__;
                    }
                    if (4 < uVar8) goto LAB_0062fe27;
LAB_0062ff65:
                    bVar24 = true;
                  }
                  else {
                    if (uVar9 != 0x40) {
                      if (uVar9 == 0x20) goto LAB_0062fe6e;
                      goto LAB_0062ff65;
                    }
                    if (uVar8 < 3) {
                      if (((ulong)local_248 & 1) == 0) {
                        uVar8 = (int)local_248 + uVar8 * 2;
                        if (4 < uVar8) {
                          __return_storage_ptr__ = (ValidationState_t *)&stack0xfffffffffffffdf8;
                          ValidationState_t::diag
                                    ((DiagnosticStream *)__return_storage_ptr__,vstate,
                                     SPV_ERROR_INVALID_ID,inst);
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&local_278,vstate,0x133a,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)__return_storage_ptr__,local_278._M_dataplus._M_p,
                                     local_278._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)__return_storage_ptr__,
                                     "Sequence of components starting with ",0x25);
                          std::ostream::_M_insert<unsigned_long>((ulong)__return_storage_ptr__);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)__return_storage_ptr__," and ending with ",0x11);
                          std::ostream::_M_insert<unsigned_long>((ulong)__return_storage_ptr__);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)__return_storage_ptr__," gets larger than 3",0x13);
                          pVVar17 = (ValidationState_t *)(ulong)(uint)local_38;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_278._M_dataplus._M_p != &local_278.field_2) {
                            operator_delete(local_278._M_dataplus._M_p,
                                            local_278.field_2._M_allocated_capacity + 1);
                          }
                          DiagnosticStream::~DiagnosticStream
                                    ((DiagnosticStream *)&stack0xfffffffffffffdf8);
                        }
                        if (uVar8 < 5) goto LAB_0062ff65;
                        goto LAB_0062fe27;
                      }
                      ValidationState_t::diag
                                ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                                 SPV_ERROR_INVALID_ID,inst);
                      ValidationState_t::VkErrorID_abi_cxx11_(&local_278,vstate,0x133b,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&stack0xfffffffffffffdf8,local_278._M_dataplus._M_p,
                                 local_278._M_string_length);
                      lVar18 = 0x43;
                      pcVar21 = 
                      "Component decoration value must not be 1 or 3 for 64-bit data types";
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                                 SPV_ERROR_INVALID_ID,inst);
                      ValidationState_t::VkErrorID_abi_cxx11_(&local_278,vstate,0x1e17,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&stack0xfffffffffffffdf8,local_278._M_dataplus._M_p,
                                 local_278._M_string_length);
                      lVar18 = 0x49;
                      pcVar21 = 
                      "Component decoration only allowed on 64-bit scalar and 2-component vector";
                    }
LAB_0062fdf1:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&stack0xfffffffffffffdf8,pcVar21,lVar18);
                    pVVar17 = (ValidationState_t *)(ulong)(uint)local_38;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_278._M_dataplus._M_p != &local_278.field_2) {
                      operator_delete(local_278._M_dataplus._M_p,
                                      local_278.field_2._M_allocated_capacity + 1);
                    }
                    DiagnosticStream::~DiagnosticStream
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8);
LAB_0062fe27:
                    bVar24 = false;
                  }
                  if (bVar24) goto LAB_0062ff6b;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                             SPV_ERROR_INVALID_DATA,inst);
                  lVar18 = 0x4b;
                  pcVar21 = 
                  "Attempted to get underlying data type via member index for non-struct type.";
LAB_0062fa92:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&stack0xfffffffffffffdf8,pcVar21,lVar18);
                  sVar11 = local_38;
LAB_0062faa2:
                  pVVar17 = (ValidationState_t *)(ulong)(uint)sVar11;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&stack0xfffffffffffffdf8);
                }
                goto LAB_0062ff6e;
              default:
                if (_Var3 - 0x1175 < 2) {
                  uVar1 = (inst->inst_).opcode;
                  pVVar19 = (ValidationState_t *)0x0;
                  if (uVar1 < 0xc4) {
                    if (((6 < uVar1 - 0x7e) || ((0x55U >> (uVar1 - 0x7e & 0x1f) & 1) == 0)) &&
                       (uVar1 != 0xc)) {
LAB_0062f8ed:
                      ValidationState_t::diag
                                ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                                 SPV_ERROR_INVALID_ID,inst);
                      local_278._M_dataplus._M_p = "NoUnsignedWrap";
                      if (p_Var16[1]._M_color == 0x1175) {
                        local_278._M_dataplus._M_p = "NoSignedWrap";
                      }
                      __return_storage_ptr__ =
                           (ValidationState_t *)
                           DiagnosticStream::operator<<
                                     ((DiagnosticStream *)&stack0xfffffffffffffdf8,
                                      (char **)&local_278);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)__return_storage_ptr__,
                                 " decoration may not be applied to ",0x22);
                      local_228._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
                      pDVar15 = DiagnosticStream::operator<<
                                          ((DiagnosticStream *)__return_storage_ptr__,
                                           (char **)&local_228);
                      pVVar19 = (ValidationState_t *)(ulong)(uint)pDVar15->error_;
                      pVVar17 = (ValidationState_t *)&stack0xfffffffffffffdf8;
                      goto LAB_0062f8c7;
                    }
                  }
                  else if ((uVar1 != 0xc4) && (pVVar19 = (ValidationState_t *)0x0, uVar1 != 0x1151))
                  goto LAB_0062f8ed;
                  break;
                }
                if ((_Var3 != 0x27) || (!bVar5)) goto switchD_0062f2ef_caseD_19;
                if ((inst->inst_).opcode != 0x73) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                             SPV_ERROR_INVALID_ID,inst);
                  lVar18 = 0x6f;
                  pcVar21 = 
                  "FPRoundingMode decoration can be applied only to a width-only conversion instruction for floating-point object."
                  ;
                  goto LAB_0062fa92;
                }
                bVar24 = spvIsVulkanEnv(vstate->context_->target_env);
                if (bVar24) {
                  _Var3 = (p_Var16[1]._M_parent)->_M_color;
                  if (_S_black < _Var3) {
                    __return_storage_ptr__ = (ValidationState_t *)&stack0xfffffffffffffdf8;
                    ValidationState_t::diag
                              ((DiagnosticStream *)__return_storage_ptr__,vstate,
                               SPV_ERROR_INVALID_ID,inst);
                    ValidationState_t::VkErrorID_abi_cxx11_(&local_278,vstate,0x1243,(char *)0x0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)__return_storage_ptr__,local_278._M_dataplus._M_p,
                               local_278._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)__return_storage_ptr__,
                               "In Vulkan, the FPRoundingMode mode must only by RTE or RTZ.",0x3b);
                    pVVar17 = (ValidationState_t *)(ulong)(uint)local_38;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_278._M_dataplus._M_p != &local_278.field_2) {
                      operator_delete(local_278._M_dataplus._M_p,
                                      local_278.field_2._M_allocated_capacity + 1);
                    }
                    DiagnosticStream::~DiagnosticStream
                              ((DiagnosticStream *)&stack0xfffffffffffffdf8);
                  }
                  local_280 = (spv_result_t)pVVar17;
                  if (_Var3 < 2) goto LAB_0062f57a;
                  goto LAB_0062ff6e;
                }
LAB_0062f57a:
                ppVar20 = (inst->uses_).
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ppVar4 = (inst->uses_).
                         super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pVVar17 = (ValidationState_t *)0x0;
                if (ppVar20 == ppVar4) goto LAB_0062ff6e;
                do {
                  local_254 = uVar8;
                  __return_storage_ptr__ = (ValidationState_t *)ppVar20->first;
                  iVar22 = 3;
                  OVar12 = (Op)*(ushort *)
                                ((long)&(__return_storage_ptr__->unresolved_forward_ids_)._M_h.
                                        _M_buckets + 2);
                  iVar23 = 3;
                  if ((((OVar12 != OpFConvert) &&
                       (bVar24 = spvOpcodeIsDebug(OVar12), iVar23 = iVar22, !bVar24)) &&
                      (bVar24 = Instruction::IsNonSemantic((Instruction *)__return_storage_ptr__),
                      !bVar24)) &&
                     (bVar24 = spvOpcodeIsDecoration
                                         ((uint)*(ushort *)
                                                 ((long)&(__return_storage_ptr__->
                                                         unresolved_forward_ids_)._M_h._M_buckets +
                                                 2)), !bVar24)) {
                    if ((*(short *)((long)&(__return_storage_ptr__->unresolved_forward_ids_)._M_h.
                                           _M_buckets + 2) == 0x3e) && (ppVar20->second == 2)) {
                      uVar8 = Instruction::GetOperandAs<unsigned_int>
                                        ((Instruction *)__return_storage_ptr__,0);
                      pIVar14 = ValidationState_t::FindDef(vstate,uVar8);
                      uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar14,0);
                      local_250 = (ValidationState_t *)ValidationState_t::FindDef(vstate,uVar8);
                      uVar8 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_250,2);
                      __return_storage_ptr__ = (ValidationState_t *)(ulong)uVar8;
                      bVar24 = ValidationState_t::IsFloatScalarOrVectorType(vstate,uVar8);
                      if ((bVar24) &&
                         (uVar9 = ValidationState_t::GetBitWidth(vstate,uVar8), uVar9 == 0x10)) {
                        SVar10 = Instruction::GetOperandAs<spv::StorageClass>
                                           ((Instruction *)local_250,1);
                        iVar23 = 0;
                        if (((StorageBuffer < SVar10) || ((0x120eU >> (SVar10 & 0x1f) & 1) == 0)) &&
                           (iVar23 = 0, SVar10 != PhysicalStorageBuffer)) {
                          __return_storage_ptr__ = (ValidationState_t *)&stack0xfffffffffffffdf8;
                          ValidationState_t::diag
                                    ((DiagnosticStream *)__return_storage_ptr__,vstate,
                                     SPV_ERROR_INVALID_ID,inst);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)__return_storage_ptr__,
                                     "FPRoundingMode decoration can be applied only to the Object operand of an OpStore in the StorageBuffer, PhysicalStorageBuffer, Uniform, PushConstant, Input, or Output Storage Classes."
                                     ,0xb7);
                          local_280 = local_38;
                          DiagnosticStream::~DiagnosticStream
                                    ((DiagnosticStream *)__return_storage_ptr__);
                          iVar23 = 1;
                        }
                        goto LAB_0062f736;
                      }
                      ValidationState_t::diag
                                ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                                 SPV_ERROR_INVALID_ID,inst);
                      lVar18 = 0x9f;
                      pcVar21 = 
                      "FPRoundingMode decoration can be applied only to the Object operand of an OpStore storing through a pointer to a 16-bit floating-point scalar or vector object."
                      ;
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&stack0xfffffffffffffdf8,vstate,
                                 SPV_ERROR_INVALID_ID,inst);
                      lVar18 = 0x52;
                      pcVar21 = 
                      "FPRoundingMode decoration can be applied only to the Object operand of an OpStore."
                      ;
                    }
                    __return_storage_ptr__ = (ValidationState_t *)&stack0xfffffffffffffdf8;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)__return_storage_ptr__,pcVar21,lVar18);
                    local_280 = local_38;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)__return_storage_ptr__);
                    iVar23 = 1;
                  }
LAB_0062f736:
                  if ((iVar23 != 3) && (iVar23 != 0)) {
                    pVVar17 = (ValidationState_t *)(ulong)(uint)local_280;
                    unaff_R13 = (ValidationState_t *)(ulong)local_254;
                    goto LAB_0062ff6e;
                  }
                  ppVar20 = ppVar20 + 1;
                  uVar8 = local_254;
                } while (ppVar20 != ppVar4);
                unaff_R13 = (ValidationState_t *)(ulong)local_254;
LAB_0062ff6b:
                pVVar17 = (ValidationState_t *)0x0;
LAB_0062ff6e:
                bVar24 = (int)pVVar17 != 0;
                if (bVar24) {
                  unaff_R13 = pVVar17;
                }
joined_r0x0062ff75:
                unaff_R13 = (ValidationState_t *)((ulong)unaff_R13 & 0xffffffff);
                if (!bVar24) goto switchD_0062f2ef_caseD_19;
                goto LAB_0062f8d8;
              }
LAB_0062f8cc:
              bVar24 = (int)pVVar19 != 0;
              if (bVar24) {
                unaff_R13 = pVVar19;
              }
              unaff_R13 = (ValidationState_t *)((ulong)unaff_R13 & 0xffffffff);
              if (bVar24) {
LAB_0062f8d8:
                bVar24 = false;
              }
              else {
switchD_0062f2ef_caseD_19:
                bVar24 = true;
              }
              if (!bVar24) {
                iVar23 = 1;
                pVVar19 = local_240;
                pVVar17 = local_238;
                goto LAB_00630257;
              }
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
            } while (p_Var16 != local_230);
          }
          iVar23 = 0;
          pVVar19 = local_240;
          pVVar17 = local_238;
        }
      }
LAB_00630257:
      if ((iVar23 != 3) && (iVar23 != 0)) {
        return (spv_result_t)unaff_R13;
      }
      pVVar17 = (ValidationState_t *)std::_Rb_tree_increment((_Rb_tree_node_base *)pVVar17);
    } while (pVVar17 != pVVar19);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t CheckDecorationsFromDecoration(ValidationState_t& vstate) {
  // Some rules are only checked for shaders.
  const bool is_shader = vstate.HasCapability(spv::Capability::Shader);

  for (const auto& kv : vstate.id_decorations()) {
    const uint32_t id = kv.first;
    const auto& decorations = kv.second;
    if (decorations.empty()) continue;

    const Instruction* inst = vstate.FindDef(id);
    assert(inst);

    // We assume the decorations applied to a decoration group have already
    // been propagated down to the group members.
    if (inst->opcode() == spv::Op::OpDecorationGroup) continue;

    for (const auto& decoration : decorations) {
      switch (decoration.dec_type()) {
        case spv::Decoration::Component:
          PASS_OR_BAIL(CheckComponentDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::FPRoundingMode:
          if (is_shader)
            PASS_OR_BAIL(
                CheckFPRoundingModeForShaders(vstate, *inst, decoration));
          break;
        case spv::Decoration::NonWritable:
          PASS_OR_BAIL(CheckNonWritableDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Uniform:
        case spv::Decoration::UniformId:
          PASS_OR_BAIL(CheckUniformDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::NoSignedWrap:
        case spv::Decoration::NoUnsignedWrap:
          PASS_OR_BAIL(CheckIntegerWrapDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Block:
        case spv::Decoration::BufferBlock:
          PASS_OR_BAIL(CheckBlockDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Location:
          PASS_OR_BAIL(CheckLocationDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::RelaxedPrecision:
          PASS_OR_BAIL(
              CheckRelaxPrecisionDecoration(vstate, *inst, decoration));
          break;
        default:
          break;
      }
    }
  }
  return SPV_SUCCESS;
}